

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zip.c
# Opt level: O3

ssize_t zip_entries_delete_mark(zip_t *zip,zip_entry_mark_t *entry_mark,int entry_num)

{
  int *piVar1;
  zip_modify_t zVar2;
  uint uVar3;
  mz_zip_internal_state *pmVar4;
  mz_zip_internal_state *pmVar5;
  FILE *__stream;
  void *pvVar6;
  bool bVar7;
  int iVar8;
  void *__ptr;
  ulong uVar9;
  long lVar10;
  void *pvVar11;
  size_t sVar12;
  void *pvVar13;
  zip_modify_t *pzVar14;
  ulong uVar15;
  int iVar16;
  long lVar17;
  size_t __n;
  uint uVar18;
  ulong uVar19;
  ulong uVar20;
  size_t sVar21;
  ulong uVar22;
  ulong uVar23;
  ulong uVar24;
  ulong uVar25;
  ulong uVar26;
  int local_c4;
  ulong local_c0;
  ulong local_a8;
  long local_98;
  
  sVar21 = (size_t)entry_num;
  __ptr = calloc(sVar21,4);
  if (__ptr == (void *)0x0) {
    return -0x15;
  }
  pmVar4 = (zip->archive).m_pState;
  (zip->archive).m_zip_mode = MZ_ZIP_MODE_WRITING;
  if ((FILE *)pmVar4->m_pFile != (FILE *)0x0) {
    iVar8 = fseeko((FILE *)pmVar4->m_pFile,0,0);
    uVar20 = 0xfffffffffffffffd;
    if (iVar8 != 0) goto LAB_0010ff04;
  }
  if (entry_num < 1) {
    (zip->archive).m_total_files = entry_num;
    uVar19 = 0;
  }
  else {
    uVar9 = (ulong)(uint)entry_num;
    uVar22 = 0;
    uVar26 = 0;
    uVar19 = 0;
    local_c4 = 0;
    local_a8 = 0;
    local_98 = 0;
    do {
      lVar10 = (long)local_c4;
      iVar8 = local_c4 + 1;
      if (local_c4 + 1 < entry_num) {
        iVar8 = entry_num;
      }
      if (entry_mark[lVar10].type == MZ_KEEP) {
        pzVar14 = &entry_mark[lVar10 + 1].type;
        do {
          uVar22 = uVar22 + *(long *)(pzVar14 + -4);
          lVar10 = lVar10 + 1;
          uVar26 = uVar22;
          local_c4 = iVar8;
          if ((long)sVar21 <= lVar10) goto LAB_0010fce7;
          zVar2 = *pzVar14;
          pzVar14 = pzVar14 + 8;
        } while (zVar2 == MZ_KEEP);
      }
      iVar8 = (int)lVar10;
      if (iVar8 < entry_num) {
        lVar17 = (long)iVar8 << 2;
        lVar10 = 0;
        do {
          if ((&entry_mark->type)[lVar17 * 2] != MZ_DELETE) {
            iVar8 = iVar8 - (int)lVar10;
            uVar19 = uVar19 - lVar10;
            goto LAB_0010fc60;
          }
          *(undefined4 *)((long)__ptr + lVar17) = 1;
          uVar26 = uVar26 + (&entry_mark->lf_length)[lVar17];
          local_98 = local_98 + (&entry_mark->lf_length)[lVar17];
          lVar10 = lVar10 + -1;
          lVar17 = lVar17 + 4;
        } while (-sVar21 + (long)iVar8 != lVar10);
        uVar19 = uVar19 - lVar10;
        local_c4 = entry_num;
      }
      else {
LAB_0010fc60:
        local_c4 = iVar8;
        if (iVar8 < entry_num) {
          lVar10 = (long)iVar8 << 2;
          lVar17 = 0;
          do {
            if ((&entry_mark->type)[lVar10 * 2] != MZ_MOVE) {
              local_c4 = iVar8 - (int)lVar17;
              break;
            }
            pvVar11 = (pmVar4->m_central_dir).m_p;
            if (pvVar11 == (void *)0x0) {
              uVar20 = 0xfffffffffffffffd;
              goto LAB_0010ff04;
            }
            local_a8 = local_a8 + (&entry_mark->lf_length)[lVar10];
            piVar1 = (int *)((long)pvVar11 +
                            (ulong)*(uint *)((long)(pmVar4->m_central_dir_offsets).m_p + lVar10) +
                            0x2a);
            *piVar1 = *piVar1 - (int)local_98;
            lVar17 = lVar17 + -1;
            lVar10 = lVar10 + 4;
            local_c4 = entry_num;
          } while (-sVar21 + (long)iVar8 != lVar17);
        }
      }
LAB_0010fce7:
      pmVar5 = (zip->archive).m_pState;
      pvVar11 = calloc(1,0x1000);
      if (pvVar11 == (void *)0x0) {
        uVar20 = 0xffffffffffffffeb;
      }
      else {
        if ((long)local_a8 < 1) {
          uVar20 = 0;
        }
        else {
          uVar23 = 0;
          uVar15 = uVar26;
          uVar24 = local_a8;
          local_c0 = uVar22;
          do {
            __n = 0x1000;
            if (uVar24 < 0x1000) {
              __n = uVar24;
            }
            __stream = (FILE *)pmVar5->m_pFile;
            if (__stream == (FILE *)0x0) {
              pvVar6 = pmVar5->m_pMem;
              if (pvVar6 == (void *)0x0) {
                uVar20 = 0xffffffffffffffed;
                goto LAB_0010fe81;
              }
              uVar25 = pmVar5->m_mem_size;
              uVar20 = 0xfffffffffffffff6;
              if ((uVar25 < local_c0) || (uVar25 < uVar15)) break;
              if ((uVar25 + (long)pvVar6 < (long)((long)pvVar6 + local_c0) + __n) ||
                 (uVar25 + (long)pvVar6 < (long)((long)pvVar6 + uVar15) + __n)) break;
              memmove((void *)((long)pvVar6 + local_c0),(void *)((long)pvVar6 + uVar15),__n);
            }
            else {
              iVar8 = fseeko(__stream,uVar15,0);
              uVar20 = 0xffffffffffffffe5;
              if (iVar8 != 0) break;
              sVar12 = fread(pvVar11,1,__n,__stream);
              if (sVar12 != __n) {
                uVar20 = 0xffffffffffffffe4;
                break;
              }
              iVar8 = fseeko(__stream,local_c0,0);
              if (iVar8 != 0) break;
              sVar12 = fwrite(pvVar11,1,__n,__stream);
              if (sVar12 != __n) {
                uVar20 = 0xffffffffffffffe3;
                break;
              }
            }
            local_c0 = local_c0 + __n;
            uVar15 = uVar15 + __n;
            uVar23 = uVar23 + __n;
            uVar25 = uVar24 - __n;
            bVar7 = (long)__n <= (long)uVar24;
            uVar20 = uVar23;
            uVar24 = uVar25;
          } while (uVar25 != 0 && bVar7);
        }
        free(pvVar11);
      }
LAB_0010fe81:
      if (uVar20 != local_a8) goto LAB_0010ff04;
      uVar22 = uVar22 + local_a8;
      uVar26 = uVar26 + local_a8;
    } while (local_c4 < entry_num);
    (zip->archive).m_archive_size = (zip->archive).m_archive_size - local_98;
    (zip->archive).m_total_files = entry_num - (int)uVar19;
    if (0 < entry_num) {
      uVar20 = 0;
LAB_0010ff4e:
      uVar26 = (ulong)(int)uVar20;
      uVar18 = (int)uVar20 + 1;
      if ((int)uVar18 < entry_num) {
        uVar18 = entry_num;
      }
      lVar10 = uVar26 << 0x20;
      do {
        if (*(int *)((long)__ptr + uVar26 * 4) != 0) {
          if ((int)uVar26 < entry_num) {
            uVar20 = lVar10 >> 0x20;
            if (*(int *)((long)__ptr + (lVar10 >> 0x1e)) != 0) goto LAB_0010ff92;
            bVar7 = true;
          }
          else {
            bVar7 = false;
            uVar20 = uVar26 & 0xffffffff;
          }
          goto LAB_0010ffc0;
        }
        uVar26 = uVar26 + 1;
        lVar10 = lVar10 + 0x100000000;
      } while ((long)uVar26 < (long)uVar9);
      bVar7 = false;
      uVar26 = (ulong)uVar18;
      uVar20 = (ulong)uVar18;
      goto LAB_0010ffc0;
    }
  }
  iVar8 = 0;
LAB_0010fef7:
  (pmVar4->m_central_dir_offsets).m_size = (long)(entry_num - iVar8) << 2;
  uVar20 = uVar19;
LAB_0010ff04:
  free(__ptr);
  return uVar20;
  while (uVar22 = uVar20 + 1, lVar10 = uVar20 * 4, uVar20 = uVar22,
        *(int *)((long)__ptr + lVar10 + 4) != 0) {
LAB_0010ff92:
    if (uVar9 - 1 == uVar20) {
      bVar7 = false;
      uVar20 = (ulong)(uint)entry_num;
      goto LAB_0010ffc0;
    }
  }
  bVar7 = (long)uVar22 < (long)uVar9;
LAB_0010ffc0:
  iVar8 = (int)uVar20;
  if ((int)uVar26 == entry_num) goto LAB_001100e4;
  pvVar11 = (pmVar4->m_central_dir_offsets).m_p;
  uVar18 = *(uint *)((long)pvVar11 + (long)(int)uVar26 * 4);
  uVar26 = (ulong)uVar18;
  if (iVar8 == entry_num) {
    sVar21 = 0;
  }
  else {
    pvVar6 = (pmVar4->m_central_dir).m_p;
    uVar22 = (ulong)iVar8;
    uVar3 = *(uint *)((long)pvVar11 + uVar22 * 4);
    pvVar11 = (void *)((long)pvVar6 + (ulong)uVar3);
    sVar21 = (pmVar4->m_central_dir).m_size - (ulong)uVar3;
    if ((pvVar6 != (void *)0x0) && (uVar18 == 0)) {
      memmove(pvVar6,pvVar11,sVar21);
      pvVar13 = realloc((pmVar4->m_central_dir).m_p,sVar21);
      (pmVar4->m_central_dir).m_p = pvVar13;
      if (!bVar7) goto LAB_001100d4;
      pvVar13 = (pmVar4->m_central_dir_offsets).m_p;
      uVar15 = uVar22;
      do {
        piVar1 = (int *)((long)pvVar13 + uVar15 * 4);
        *piVar1 = *piVar1 - (uVar3 - uVar18);
        uVar15 = uVar15 + 1;
      } while (uVar9 != uVar15);
    }
    if (((pvVar6 != (void *)0x0) && (sVar21 * uVar26 != 0)) &&
       (memmove((void *)((long)pvVar6 + uVar26),pvVar11,sVar21), bVar7)) {
      pvVar11 = (pmVar4->m_central_dir_offsets).m_p;
      do {
        piVar1 = (int *)((long)pvVar11 + uVar22 * 4);
        *piVar1 = *piVar1 - (uVar3 - uVar18);
        uVar22 = uVar22 + 1;
      } while (uVar9 != uVar22);
    }
  }
LAB_001100d4:
  (pmVar4->m_central_dir).m_size = sVar21 + uVar26;
LAB_001100e4:
  if (entry_num <= iVar8) goto code_r0x001100ec;
  goto LAB_0010ff4e;
code_r0x001100ec:
  iVar8 = 0;
  uVar20 = 0;
  do {
    lVar10 = (long)(int)uVar20;
    uVar18 = (int)uVar20 + 1;
    if ((int)uVar18 < entry_num) {
      uVar18 = entry_num;
    }
    do {
      if (*(int *)((long)__ptr + lVar10 * 4) != 0) {
        uVar18 = (uint)lVar10;
        break;
      }
      lVar10 = lVar10 + 1;
    } while (lVar10 < (long)uVar9);
    if (uVar18 == entry_num) goto LAB_0010fef7;
    uVar26 = (long)(int)uVar18;
    uVar20 = (ulong)uVar18;
    if ((int)uVar18 < entry_num) {
      while (uVar20 = uVar26, *(int *)((long)__ptr + uVar26 * 4) != 0) {
        uVar26 = uVar26 + 1;
        iVar16 = entry_num;
        if (uVar9 == uVar26) goto LAB_00110170;
      }
    }
    iVar16 = (int)uVar20;
    if (entry_num - iVar16 == 0 || entry_num < iVar16) break;
    pvVar11 = (pmVar4->m_central_dir_offsets).m_p;
    uVar26 = 0;
    do {
      *(undefined4 *)((long)pvVar11 + uVar26 * 4 + (long)(int)uVar18 * 4) =
           *(undefined4 *)((long)pvVar11 + uVar26 * 4 + (long)iVar16 * 4);
      uVar26 = uVar26 + 1;
    } while ((uint)(entry_num - iVar16) != uVar26);
    iVar8 = (iVar8 - uVar18) + iVar16;
  } while( true );
LAB_00110170:
  iVar8 = (iVar8 - uVar18) + iVar16;
  goto LAB_0010fef7;
}

Assistant:

static ssize_t zip_entries_delete_mark(struct zip_t *zip,
                                       struct zip_entry_mark_t *entry_mark,
                                       int entry_num) {
  mz_uint64 writen_num = 0;
  mz_uint64 read_num = 0;
  size_t deleted_length = 0;
  size_t move_length = 0;
  int i = 0;
  size_t deleted_entry_num = 0;
  ssize_t n = 0;

  mz_bool *deleted_entry_flag_array =
      (mz_bool *)calloc(entry_num, sizeof(mz_bool));
  if (deleted_entry_flag_array == NULL) {
    return ZIP_EOOMEM;
  }

  mz_zip_internal_state *pState = zip->archive.m_pState;
  zip->archive.m_zip_mode = MZ_ZIP_MODE_WRITING;

  if (pState->m_pFile) {
    if (MZ_FSEEK64(pState->m_pFile, 0, SEEK_SET)) {
      CLEANUP(deleted_entry_flag_array);
      return ZIP_ENOENT;
    }
  }

  while (i < entry_num) {
    while ((i < entry_num) && (entry_mark[i].type == MZ_KEEP)) {
      writen_num += entry_mark[i].lf_length;
      read_num = writen_num;
      i++;
    }

    while ((i < entry_num) && (entry_mark[i].type == MZ_DELETE)) {
      deleted_entry_flag_array[i] = MZ_TRUE;
      read_num += entry_mark[i].lf_length;
      deleted_length += entry_mark[i].lf_length;
      i++;
      deleted_entry_num++;
    }

    while ((i < entry_num) && (entry_mark[i].type == MZ_MOVE)) {
      move_length += entry_mark[i].lf_length;
      mz_uint8 *p = &MZ_ZIP_ARRAY_ELEMENT(
          &pState->m_central_dir, mz_uint8,
          MZ_ZIP_ARRAY_ELEMENT(&pState->m_central_dir_offsets, mz_uint32, i));
      if (!p) {
        CLEANUP(deleted_entry_flag_array);
        return ZIP_ENOENT;
      }
      mz_uint32 offset = MZ_READ_LE32(p + MZ_ZIP_CDH_LOCAL_HEADER_OFS);
      offset -= (mz_uint32)deleted_length;
      MZ_WRITE_LE32(p + MZ_ZIP_CDH_LOCAL_HEADER_OFS, offset);
      i++;
    }

    n = zip_files_move(zip, writen_num, read_num, move_length);
    if (n != (ssize_t)move_length) {
      CLEANUP(deleted_entry_flag_array);
      return n;
    }
    writen_num += move_length;
    read_num += move_length;
  }

  zip->archive.m_archive_size -= (mz_uint64)deleted_length;
  zip->archive.m_total_files =
      (mz_uint32)entry_num - (mz_uint32)deleted_entry_num;

  zip_central_dir_delete(pState, deleted_entry_flag_array, entry_num);
  CLEANUP(deleted_entry_flag_array);

  return (ssize_t)deleted_entry_num;
}